

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O0

void release_scaled_references(AV1_COMP *cpi)

{
  byte bVar1;
  int *piVar2;
  int iVar3;
  long *in_RDI;
  bool bVar4;
  _Bool same_resoln;
  RefCntBuffer *ref;
  int golden_ref;
  RefCntBuffer *buf;
  int i;
  _Bool release_golden;
  _Bool refresh_golden;
  AV1_COMMON *cm;
  bool local_33;
  bool local_32;
  MV_REFERENCE_FRAME in_stack_ffffffffffffffcf;
  AV1_COMP *in_stack_ffffffffffffffd0;
  int local_18;
  bool local_12;
  
  bVar1 = *(byte *)(in_RDI + 0x85af);
  local_12 = true;
  local_32 = (bool)in_stack_ffffffffffffffcf;
  for (local_18 = 0; local_18 < 7; local_18 = local_18 + 1) {
    piVar2 = (int *)in_RDI[(long)local_18 + 0x85a7];
    bVar4 = local_18 == 3;
    if ((((bVar4) && (iVar3 = is_one_pass_rt_params(in_stack_ffffffffffffffd0), iVar3 != 0)) &&
        (*(int *)(*in_RDI + 0xc750) == 0)) && (piVar2 != (int *)0x0)) {
      in_stack_ffffffffffffffd0 =
           (AV1_COMP *)get_ref_frame_buf((AV1_COMMON *)in_stack_ffffffffffffffd0,local_32);
      local_32 = false;
      if (piVar2[0x13c] ==
          (((anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 *)
           ((in_stack_ffffffffffffffd0->enc_quant_dequant_params).quants.y_quant + 0x4e))->field_0).
          y_crop_width) {
        local_32 = piVar2[0x13e] ==
                   (((anon_union_8_2_abde48f3_for_yv12_buffer_config_6 *)
                    ((anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 *)
                     ((in_stack_ffffffffffffffd0->enc_quant_dequant_params).quants.y_quant + 0x4e) +
                    1))->field_0).y_crop_height;
      }
      local_33 = true;
      if ((bVar1 & 1) == 0) {
        local_33 = local_32;
      }
      local_12 = local_33;
    }
    if ((piVar2 != (int *)0x0) && ((!bVar4 || ((bVar4 && (local_12 != false)))))) {
      *piVar2 = *piVar2 + -1;
      in_RDI[(long)local_18 + 0x85a7] = 0;
    }
  }
  return;
}

Assistant:

static inline void release_scaled_references(AV1_COMP *cpi) {
  // Scaled references should only need to be released under certain conditions:
  // if the reference will be updated, or if the scaled reference has same
  // resolution. For now only apply this to Golden for non-svc RTC mode.
  AV1_COMMON *const cm = &cpi->common;
  const bool refresh_golden = (cpi->refresh_frame.golden_frame) ? 1 : 0;
  bool release_golden = true;
  for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
    RefCntBuffer *const buf = cpi->scaled_ref_buf[i];
    const int golden_ref = (i == GOLDEN_FRAME - 1);
    if (golden_ref && is_one_pass_rt_params(cpi) && !cpi->ppi->use_svc &&
        buf != NULL) {
      const RefCntBuffer *const ref = get_ref_frame_buf(cm, GOLDEN_FRAME);
      const bool same_resoln = buf->buf.y_crop_width == ref->buf.y_crop_width &&
                               buf->buf.y_crop_height == ref->buf.y_crop_height;
      release_golden = refresh_golden || same_resoln;
    }
    if (buf != NULL && (!golden_ref || (golden_ref && release_golden))) {
      --buf->ref_count;
      cpi->scaled_ref_buf[i] = NULL;
    }
  }
}